

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_gamma_decode(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  
  iVar2 = *out_size;
  if (0 < (long)iVar2) {
    puVar3 = in->data;
    sVar8 = in->byte;
    lVar9 = 0;
    do {
      iVar5 = -1;
      uVar7 = in->bit;
      iVar6 = 1;
      do {
        iVar10 = iVar6;
        bVar1 = puVar3[sVar8];
        uVar11 = uVar7 - 1;
        in->bit = uVar11;
        if (uVar7 == 0) {
          in->bit = 7;
          sVar8 = sVar8 + 1;
          in->byte = sVar8;
          uVar11 = 7;
        }
        iVar5 = iVar5 + 1;
        uVar4 = uVar7 & 0x1f;
        uVar7 = uVar11;
        iVar6 = iVar10 + 1;
      } while ((bVar1 >> uVar4 & 1) == 0);
      if (iVar5 == 0) {
        iVar6 = 1;
      }
      else {
        iVar6 = 1;
        do {
          iVar6 = (uint)((puVar3[sVar8] >> (uVar11 & 0x1f) & 1) != 0) + iVar6 * 2;
          sVar8 = sVar8 + ((int)uVar11 < 1);
          in->byte = sVar8;
          uVar11 = uVar11 - 1 & 7;
          in->bit = uVar11;
          iVar10 = iVar10 + -1;
        } while (1 < iVar10);
      }
      *(int *)(out + lVar9 * 4) = iVar6 - (c->field_6).huffman.ncodes;
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return 0;
}

Assistant:

int cram_gamma_decode(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;

    for (i = 0, n = *out_size; i < n; i++) {
	int nz = 0;
	int val;
	//while (get_bit_MSB(in) == 0) nz++;
	nz = get_zero_bits_MSB(in);
	val = 1;
	while (nz > 0) {
	    //val <<= 1; val |= get_bit_MSB(in);
	    GET_BIT_MSB(in, val);
	    nz--;
	}

	out_i[i] = val - c->gamma.offset;
    }

    return 0;
}